

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.h
# Opt level: O3

bool __thiscall InplaceStr::operator==(InplaceStr *this,InplaceStr *rhs)

{
  char *__s1;
  char *__s2;
  int iVar1;
  uint uVar2;
  bool bVar3;
  
  __s1 = this->begin;
  __s2 = rhs->begin;
  bVar3 = true;
  if (this->end != rhs->end || __s1 != __s2) {
    uVar2 = (int)this->end - (int)__s1;
    if (uVar2 != (int)rhs->end - (int)__s2) {
      return false;
    }
    iVar1 = bcmp(__s1,__s2,(ulong)uVar2);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool operator==(const InplaceStr& rhs) const
	{
		if(begin == rhs.begin && end == rhs.end)
			return true;

		return unsigned(end - begin) == unsigned(rhs.end - rhs.begin) && memcmp(begin, rhs.begin, unsigned(end - begin)) == 0;
	}